

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall
Builder::ExtractDeps
          (Builder *this,Result *result,string *deps_type,string *deps_prefix,
          vector<Node_*,_std::allocator<Node_*>_> *deps_nodes,string *err)

{
  _Rb_tree_node_base *p_Var1;
  bool bVar2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  int *piVar5;
  long *plVar6;
  Node *pNVar7;
  bool bVar8;
  _Base_ptr p_Var9;
  string depfile;
  string content;
  DepfileParser deps;
  uint64_t slash_bits;
  string local_128;
  undefined1 local_108 [32];
  undefined1 local_e8 [16];
  StringPiece local_d8;
  _Rb_tree_node_base *local_c8;
  pointer local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  pointer *local_70 [2];
  pointer local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar3 = std::__cxx11::string::compare((char *)deps_type);
  if (iVar3 == 0) {
    p_Var1 = (_Rb_tree_node_base *)(local_e8 + 8);
    local_e8._8_4_ = _S_red;
    local_d8.str_ = (char *)0x0;
    local_c0 = (pointer)0x0;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    local_128._M_string_length = 0;
    local_128.field_2._M_local_buf[0] = '\0';
    local_d8.len_ = (size_t)p_Var1;
    local_c8 = p_Var1;
    bVar2 = CLParser::Parse((CLParser *)local_e8,&result->output,deps_prefix,&local_128,err);
    if ((bVar2) &&
       (std::__cxx11::string::_M_assign((string *)&result->output),
       (_Rb_tree_node_base *)local_d8.len_ != p_Var1)) {
      p_Var4 = (_Rb_tree_node_base *)local_d8.len_;
      do {
        local_108._0_8_ = State::GetNode(this->state_,*(StringPiece *)(p_Var4 + 1),0xffffffff);
        std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                  ((vector<Node*,std::allocator<Node*>> *)deps_nodes,(Node **)local_108);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      } while (p_Var4 != p_Var1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                               local_128.field_2._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e8);
    if (bVar2) {
      return true;
    }
    return false;
  }
  iVar3 = std::__cxx11::string::compare((char *)deps_type);
  if (iVar3 != 0) {
    Fatal("unknown deps type \'%s\'",(deps_type->_M_dataplus)._M_p);
  }
  Edge::GetUnescapedDepfile_abi_cxx11_(&local_128,result->edge);
  if (local_128._M_string_length == 0) {
    local_e8._0_8_ = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"edge with deps=gcc but no depfile makes no sense","");
    std::__cxx11::string::operator=((string *)err,(string *)local_e8);
    if ((StringPiece *)local_e8._0_8_ != &local_d8) {
      operator_delete((void *)local_e8._0_8_,(ulong)((long)(_Rb_tree_color *)local_d8.str_ + 1));
    }
    bVar2 = false;
    bVar8 = false;
    goto LAB_00194096;
  }
  local_108._0_8_ = local_108 + 0x10;
  local_108._8_8_ = 0;
  local_108[0x10] = '\0';
  iVar3 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[2])
                    (this->disk_interface_,&local_128,local_108,err);
  if (iVar3 == 1) {
    err->_M_string_length = 0;
    *(err->_M_dataplus)._M_p = '\0';
LAB_00193e07:
    if (local_108._8_8_ != 0) {
      DepfileParser::DepfileParser((DepfileParser *)local_e8);
      bVar2 = DepfileParser::Parse((DepfileParser *)local_e8,(string *)local_108,err);
      if (bVar2) {
        std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                  (deps_nodes,(long)((long)local_c8 - local_d8.len_) >> 4);
        if ((_Rb_tree_node_base *)local_d8.len_ != local_c8) {
          p_Var9 = (_Base_ptr)local_d8.len_;
          do {
            CanonicalizePath(*(char **)p_Var9,(size_t *)&p_Var9->_M_parent,(uint64_t *)&local_50);
            local_b0._M_dataplus._M_p =
                 (pointer)State::GetNode(this->state_,*(StringPiece *)p_Var9,
                                         local_50._M_dataplus._M_p);
            std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                      ((vector<Node*,std::allocator<Node*>> *)deps_nodes,(Node **)&local_b0);
            p_Var9 = (_Base_ptr)&p_Var9->_M_left;
          } while (p_Var9 != local_c8);
        }
        bVar2 = true;
        if ((g_keep_depfile == false) &&
           (iVar3 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[6])
                              (this->disk_interface_,&local_128), iVar3 < 0)) {
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_70,"deleting depfile: ","");
          piVar5 = __errno_location();
          strerror(*piVar5);
          plVar6 = (long *)std::__cxx11::string::append((char *)local_70);
          pNVar7 = (Node *)(plVar6 + 2);
          if ((Node *)*plVar6 == pNVar7) {
            local_b0.field_2._M_allocated_capacity = (size_type)(pNVar7->path_)._M_dataplus._M_p;
            local_b0.field_2._8_4_ = (undefined4)plVar6[3];
            local_b0.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          }
          else {
            local_b0.field_2._M_allocated_capacity = (size_type)(pNVar7->path_)._M_dataplus._M_p;
            local_b0._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_b0._M_string_length = plVar6[1];
          *plVar6 = (long)pNVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          local_90._M_allocated_capacity = (size_type)&local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\n","");
          std::operator+(&local_50,&local_b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_90);
          std::__cxx11::string::operator=((string *)err,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_allocated_capacity != &local_80) {
            operator_delete((void *)local_90._M_allocated_capacity,
                            local_80._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,
                            (ulong)(local_b0.field_2._M_allocated_capacity + 1));
          }
          if (local_70[0] != local_60) {
            operator_delete(local_70[0],(long)local_60[0] + 1);
          }
          goto LAB_0019404d;
        }
      }
      else {
LAB_0019404d:
        bVar2 = false;
      }
      if ((_Base_ptr)local_d8.len_ != (_Base_ptr)0x0) {
        operator_delete((void *)local_d8.len_,(long)local_c0 - local_d8.len_);
      }
      if ((StringPiece *)local_e8._0_8_ != (StringPiece *)0x0) {
        operator_delete((void *)local_e8._0_8_,(long)local_d8.str_ - local_e8._0_8_);
      }
      goto LAB_0019407d;
    }
    bVar8 = true;
    bVar2 = false;
  }
  else {
    if (iVar3 != 2) goto LAB_00193e07;
    bVar2 = false;
LAB_0019407d:
    bVar8 = false;
  }
  if ((Node *)local_108._0_8_ != (Node *)(local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
  }
LAB_00194096:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  if (bVar2) {
    return true;
  }
  return bVar8;
}

Assistant:

bool Builder::ExtractDeps(CommandRunner::Result* result,
                          const string& deps_type,
                          const string& deps_prefix,
                          vector<Node*>* deps_nodes,
                          string* err) {
  if (deps_type == "msvc") {
    CLParser parser;
    string output;
    if (!parser.Parse(result->output, deps_prefix, &output, err))
      return false;
    result->output = output;
    for (set<string>::iterator i = parser.includes_.begin();
         i != parser.includes_.end(); ++i) {
      // ~0 is assuming that with MSVC-parsed headers, it's ok to always make
      // all backslashes (as some of the slashes will certainly be backslashes
      // anyway). This could be fixed if necessary with some additional
      // complexity in IncludesNormalize::Relativize.
      deps_nodes->push_back(state_->GetNode(*i, ~0u));
    }
  } else if (deps_type == "gcc") {
    string depfile = result->edge->GetUnescapedDepfile();
    if (depfile.empty()) {
      *err = string("edge with deps=gcc but no depfile makes no sense");
      return false;
    }

    // Read depfile content.  Treat a missing depfile as empty.
    string content;
    switch (disk_interface_->ReadFile(depfile, &content, err)) {
    case DiskInterface::Okay:
      break;
    case DiskInterface::NotFound:
      err->clear();
      break;
    case DiskInterface::OtherError:
      return false;
    }
    if (content.empty())
      return true;

    DepfileParser deps(config_.depfile_parser_options);
    if (!deps.Parse(&content, err))
      return false;

    // XXX check depfile matches expected output.
    deps_nodes->reserve(deps.ins_.size());
    for (vector<StringPiece>::iterator i = deps.ins_.begin();
         i != deps.ins_.end(); ++i) {
      uint64_t slash_bits;
      CanonicalizePath(const_cast<char*>(i->str_), &i->len_, &slash_bits);
      deps_nodes->push_back(state_->GetNode(*i, slash_bits));
    }

    if (!g_keep_depfile) {
      if (disk_interface_->RemoveFile(depfile) < 0) {
        *err = string("deleting depfile: ") + strerror(errno) + string("\n");
        return false;
      }
    }
  } else {
    Fatal("unknown deps type '%s'", deps_type.c_str());
  }

  return true;
}